

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O3

sexp_conflict
sexp_bytevector_s8_ref_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int iVar1;
  sexp_conflict psVar2;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 8)) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar2;
  }
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) != 0) || (arg1->tag != 0xc)) {
      psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
      return psVar2;
    }
    iVar1 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
  }
  else {
    iVar1 = (int)((long)arg1 >> 1);
  }
  psVar2 = (sexp_conflict)
           sexp_make_integer(ctx,(long)(arg0->value).flonum_bits[(long)iVar1 + 8],
                             (long)((arg0->value).flonum_bits[(long)iVar1 + 8] >> 7));
  return psVar2;
}

Assistant:

sexp sexp_bytevector_s8_ref_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_integer(ctx, bytevector_s8_ref(sexp_bytes_data(arg0), sexp_sint_value(arg1)));
  return res;
}